

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O1

void __thiscall gl4cts::IncompleteTextureAccess::SamplerTest::PrepareVertexArrays(SamplerTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 *puVar4;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_vao == 0) {
    (**(code **)(lVar3 + 0x708))(1,&this->m_vao);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"gGenVertexArrays has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cIncompleteTextureAccessTests.cpp"
                    ,0x17b);
    (**(code **)(lVar3 + 0xd8))(this->m_vao);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"gBindVertexArrays has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cIncompleteTextureAccessTests.cpp"
                    ,0x17e);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void SamplerTest::PrepareVertexArrays()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Sanity checks.*/
	if (m_vao)
	{
		throw 0;
	}

	/* Empty vao creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "gGenVertexArrays has failed");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "gBindVertexArrays has failed");
}